

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

SimpleRecurrentLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::SimpleRecurrentLayerParams>
          (Arena *arena)

{
  SimpleRecurrentLayerParams *pSVar1;
  
  if (arena != (Arena *)0x0) {
    pSVar1 = DoCreateMessage<CoreML::Specification::SimpleRecurrentLayerParams>(arena);
    return pSVar1;
  }
  pSVar1 = (SimpleRecurrentLayerParams *)operator_new(0x48);
  CoreML::Specification::SimpleRecurrentLayerParams::SimpleRecurrentLayerParams
            (pSVar1,(Arena *)0x0,false);
  return pSVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }